

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

GLenum cgltfPrimTypeToGl(cgltf_primitive_type type)

{
  if (type < (cgltf_primitive_type_triangle_fan|cgltf_primitive_type_lines)) {
    return cgltfPrimTypeToGl::lu[type];
  }
  __assert_fail("type < tl::size(lu)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/utils.cpp"
                ,0x77,"GLenum cgltfPrimTypeToGl(cgltf_primitive_type)");
}

Assistant:

GLenum cgltfPrimTypeToGl(cgltf_primitive_type type)
{
    static const GLenum lu[] = {
        GL_POINTS,
        GL_LINES,
        GL_LINE_LOOP,
        GL_LINE_STRIP,
        GL_TRIANGLES,
        GL_TRIANGLE_STRIP,
        GL_TRIANGLE_FAN
    };
    assert(type < tl::size(lu));
    return lu[type];
}